

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  LogMessage *other;
  Type *pTVar4;
  _Base_ptr p_Var5;
  int index;
  _Base_ptr this_00;
  _Rb_tree_header *p_Var6;
  LogFinisher local_69;
  LogMessage local_68;
  
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      bVar1 = *(byte *)&p_Var5[1]._M_left;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x34);
        other = LogMessage::operator<<
                          (&local_68,
                           "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_69,other);
        LogMessage::~LogMessage(&local_68);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
        if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\x01') {
          this_00 = p_Var5[1]._M_parent;
          if (0 < *(int *)&this_00->_M_parent) {
            index = 0;
            do {
              pTVar4 = RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                                 ((RepeatedPtrFieldBase *)this_00,index);
              iVar3 = (*pTVar4->_vptr_MessageLite[8])(pTVar4);
              if ((char)iVar3 == '\0') {
                return false;
              }
              index = index + 1;
              this_00 = p_Var5[1]._M_parent;
            } while (index < *(int *)&this_00->_M_parent);
          }
        }
        else if (((ulong)p_Var5[1]._M_left & 0x10000) == 0) {
          if (((ulong)p_Var5[1]._M_left & 0x100000) == 0) {
            cVar2 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x40))();
          }
          else {
            cVar2 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x48))();
          }
          if (cVar2 == '\0') {
            return false;
          }
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  return true;
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}